

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

char * __thiscall
ImFont::CalcWordWrapPositionA(ImFont *this,float scale,char *text,char *text_end,float wrap_width)

{
  bool bVar1;
  uint c_00;
  int iVar2;
  char *in_RDX;
  char *in_RSI;
  int *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float char_width;
  char *next_s;
  uint c;
  char *s;
  bool inside_word;
  char *prev_word_end;
  char *word_end;
  float blank_width;
  float word_width;
  float line_width;
  char *local_90;
  bool local_85;
  float local_84;
  undefined4 in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  char *local_68;
  char *local_58;
  bool local_49;
  char *local_48;
  char *local_40;
  float local_38;
  float local_34;
  float local_30;
  char *local_8;
  
  local_30 = 0.0;
  local_34 = 0.0;
  local_38 = 0.0;
  local_48 = (char *)0x0;
  local_49 = true;
  local_58 = in_RSI;
  local_40 = in_RSI;
LAB_004d273b:
  do {
    if (in_RDX <= local_58) {
LAB_004d29a9:
      if ((local_58 == in_RSI) && (in_RSI < in_RDX)) {
        local_8 = local_58 + 1;
      }
      else {
        local_8 = local_58;
      }
      return local_8;
    }
    c_00 = (uint)*local_58;
    if (c_00 < 0x80) {
      local_68 = local_58 + 1;
    }
    else {
      local_68 = local_58;
      iVar2 = ImTextCharFromUtf8((uint *)CONCAT44(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90),(char *)in_RDI,local_58
                                );
      local_68 = local_68 + iVar2;
    }
    if (c_00 == 0) goto LAB_004d29a9;
    if (0x1f < c_00) {
LAB_004d2802:
      if ((int)c_00 < *in_RDI) {
        local_84 = *(float *)(*(long *)(in_RDI + 2) + (ulong)c_00 * 4);
      }
      else {
        local_84 = (float)in_RDI[4];
      }
      bVar1 = ImCharIsBlankW(c_00);
      if (bVar1) {
        if (local_49) {
          local_30 = local_38 + local_30;
          local_38 = 0.0;
          local_40 = local_58;
        }
        local_38 = local_84 + local_38;
        local_49 = false;
      }
      else {
        local_34 = local_84 + local_34;
        if (local_49) {
          local_40 = local_68;
        }
        else {
          local_48 = local_40;
          local_30 = local_34 + local_38 + local_30;
          local_38 = 0.0;
          local_34 = 0.0;
        }
        local_85 = false;
        if ((((c_00 != 0x2e) && (local_85 = false, c_00 != 0x2c)) &&
            (local_85 = false, c_00 != 0x3b)) &&
           ((local_85 = false, c_00 != 0x21 && (local_85 = false, c_00 != 0x3f)))) {
          local_85 = c_00 != 0x22;
        }
        local_49 = local_85;
      }
      if (in_XMM1_Da / in_XMM0_Da < local_30 + local_34) {
        if (local_34 < in_XMM1_Da / in_XMM0_Da) {
          if (local_48 == (char *)0x0) {
            local_90 = local_40;
          }
          else {
            local_90 = local_48;
          }
          local_58 = local_90;
        }
        goto LAB_004d29a9;
      }
      local_58 = local_68;
      in_stack_ffffffffffffff94 = local_84;
      goto LAB_004d273b;
    }
    if (c_00 == 10) {
      local_38 = 0.0;
      local_34 = 0.0;
      local_30 = 0.0;
      local_49 = true;
      local_58 = local_68;
    }
    else {
      if (c_00 != 0xd) goto LAB_004d2802;
      local_58 = local_68;
    }
  } while( true );
}

Assistant:

const char* ImFont::CalcWordWrapPositionA(float scale, const char* text, const char* text_end, float wrap_width) const
{
    // For references, possible wrap point marked with ^
    //  "aaa bbb, ccc,ddd. eee   fff. ggg!"
    //      ^    ^    ^   ^   ^__    ^    ^

    // List of hardcoded separators: .,;!?'"

    // Skip extra blanks after a line returns (that includes not counting them in width computation)
    // e.g. "Hello    world" --> "Hello" "World"

    // Cut words that cannot possibly fit within one line.
    // e.g.: "The tropical fish" with ~5 characters worth of width --> "The tr" "opical" "fish"
    float line_width = 0.0f;
    float word_width = 0.0f;
    float blank_width = 0.0f;
    wrap_width /= scale; // We work with unscaled widths to avoid scaling every characters

    const char* word_end = text;
    const char* prev_word_end = NULL;
    bool inside_word = true;

    const char* s = text;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)*s;
        const char* next_s;
        if (c < 0x80)
            next_s = s + 1;
        else
            next_s = s + ImTextCharFromUtf8(&c, s, text_end);
        if (c == 0)
            break;

        if (c < 32)
        {
            if (c == '\n')
            {
                line_width = word_width = blank_width = 0.0f;
                inside_word = true;
                s = next_s;
                continue;
            }
            if (c == '\r')
            {
                s = next_s;
                continue;
            }
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX);
        if (ImCharIsBlankW(c))
        {
            if (inside_word)
            {
                line_width += blank_width;
                blank_width = 0.0f;
                word_end = s;
            }
            blank_width += char_width;
            inside_word = false;
        }
        else
        {
            word_width += char_width;
            if (inside_word)
            {
                word_end = next_s;
            }
            else
            {
                prev_word_end = word_end;
                line_width += word_width + blank_width;
                word_width = blank_width = 0.0f;
            }

            // Allow wrapping after punctuation.
            inside_word = (c != '.' && c != ',' && c != ';' && c != '!' && c != '?' && c != '\"');
        }

        // We ignore blank width at the end of the line (they can be skipped)
        if (line_width + word_width > wrap_width)
        {
            // Words that cannot possibly fit within an entire line will be cut anywhere.
            if (word_width < wrap_width)
                s = prev_word_end ? prev_word_end : word_end;
            break;
        }

        s = next_s;
    }

    // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
    // +1 may not be a character start point in UTF-8 but it's ok because caller loops use (text >= word_wrap_eol).
    if (s == text && text < text_end)
        return s + 1;
    return s;
}